

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_login(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  imapstate iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((data->state).aptr.user == (char *)0x0) {
    iVar2 = IMAP_STOP;
  }
  else {
    pcVar3 = imap_atom(conn->user,false);
    pcVar4 = imap_atom(conn->passwd,false);
    pcVar6 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "";
    }
    pcVar5 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
    CVar1 = imap_sendf(data,"LOGIN %s %s",pcVar6,pcVar5);
    (*Curl_cfree)(pcVar3);
    (*Curl_cfree)(pcVar4);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    iVar2 = IMAP_LOGIN;
  }
  (data->conn->proto).imapc.state = iVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode imap_perform_login(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  char *user;
  char *passwd;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we do not */
  if(!data->state.aptr.user) {
    imap_state(data, IMAP_STOP);

    return result;
  }

  /* Make sure the username and password are in the correct atom format */
  user = imap_atom(conn->user, FALSE);
  passwd = imap_atom(conn->passwd, FALSE);

  /* Send the LOGIN command */
  result = imap_sendf(data, "LOGIN %s %s", user ? user : "",
                      passwd ? passwd : "");

  free(user);
  free(passwd);

  if(!result)
    imap_state(data, IMAP_LOGIN);

  return result;
}